

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk_conflict * lair_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool quest;
  ushort uVar1;
  connector *join;
  wchar_t ncol;
  dun_data *pdVar2;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  void *p_00;
  connector *pcVar10;
  chunk *c;
  chunk *c_00;
  cave_profile *pcVar11;
  chunk *c_01;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  wchar_t y0;
  int iVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  wchar_t in_R8D;
  wchar_t x0;
  ulong in_R9;
  int iVar22;
  
  uVar5 = Rand_div(10);
  iVar15 = 0x5f;
  if (dun->quest == false) {
    uVar6 = uVar5 + (int)p->depth / 0x18 + 1;
    iVar15 = 0x46;
    if ((1 < (int)uVar6) && (iVar15 = 0x4b, uVar6 != 2)) {
      iVar15 = 0x50;
      if ((3 < uVar6) && (iVar15 = 0x55, uVar6 != 4)) {
        iVar15 = (uint)(5 < uVar6) * 5 + 0x5a;
      }
    }
  }
  uVar1 = z_info->dungeon_hgt;
  uVar5 = Rand_div(10);
  wVar8 = (int)((uVar5 + iVar15) * (uint)uVar1) / 100;
  uVar1 = z_info->dungeon_wid;
  uVar5 = Rand_div(10);
  pdVar2 = dun;
  wVar16 = (wchar_t)in_R9;
  wVar9 = (int)((uVar5 + iVar15) * (uint)uVar1) / 100;
  if (wVar8 <= min_height) {
    wVar8 = min_height;
  }
  if ((int)(uint)z_info->dungeon_hgt <= wVar8) {
    wVar8 = (uint)z_info->dungeon_hgt;
  }
  if (wVar9 <= min_width) {
    wVar9 = min_width;
  }
  if ((int)(uint)z_info->dungeon_wid <= wVar9) {
    wVar9 = (uint)z_info->dungeon_wid;
  }
  join = dun->join;
  wVar17 = dun->profile->block_size;
  dun->block_hgt = wVar17;
  pdVar2->block_wid = wVar17;
  pdVar2->join = (connector *)0x0;
  if (pdVar2->persist == true) {
    iVar15 = 5;
    if (wVar9 < L'd') {
      iVar15 = wVar9 / 0x14;
    }
    if (iVar15 < 0) {
      __assert_fail("range >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0x3e5,
                    "int find_joinfree_vertical_seam(const struct connector *, int, int, int, int)")
      ;
    }
    iVar22 = wVar9 / 2;
    p_00 = mem_zalloc((ulong)(iVar15 * 2 + 1));
    if (join != (connector *)0x0) {
      pcVar10 = join;
      do {
        wVar16 = (pcVar10->grid).x;
        iVar20 = wVar16 - iVar22;
        iVar13 = -iVar20;
        if (0 < iVar20) {
          iVar13 = iVar20;
        }
        if (((iVar13 <= iVar15) && (wVar17 = (pcVar10->grid).y, L'\xffffffff' < wVar17)) &&
           (wVar17 < wVar8)) {
          *(undefined1 *)((long)p_00 + (long)(wVar16 + (iVar15 - iVar22))) = 1;
        }
        pcVar10 = pcVar10->next;
      } while (pcVar10 != (connector *)0x0);
    }
    if (iVar15 == 0) {
      mem_free(p_00);
      return (chunk_conflict *)0x0;
    }
    uVar14 = (ulong)(iVar15 + 1);
    wVar17 = L'\xffffffff';
    wVar18 = L'\0';
    do {
      uVar19 = (long)wVar18 + 1;
      in_R8D = wVar18;
      if (*(char *)((long)p_00 + (long)wVar18) == '\0') {
        if (*(char *)((long)p_00 + uVar19) == '\0') {
          in_R8D = wVar18 + (iVar22 - iVar15);
          uVar21 = wVar18 - iVar15;
          uVar6 = -uVar21;
          if (0 < (int)uVar21) {
            uVar6 = uVar21;
          }
          in_R9 = (ulong)uVar6;
          iVar13 = (int)uVar14;
          if ((int)uVar6 <= iVar13) {
            uVar14 = in_R9;
          }
          if ((int)uVar6 < iVar13) {
            wVar17 = in_R8D;
          }
        }
        else {
          uVar19 = (ulong)(uint)(wVar18 + L'\x02');
        }
      }
      wVar16 = (wchar_t)in_R9;
      wVar18 = (wchar_t)uVar19;
    } while (SBORROW4(wVar18,iVar15 * 2) != wVar18 + iVar15 * -2 < 0);
    mem_free(p_00);
    if (wVar17 < L'\x03') {
      return (chunk_conflict *)0x0;
    }
    wVar17 = wVar17 + L'\x01';
    if (wVar9 - wVar17 < 4) {
      return (chunk_conflict *)0x0;
    }
  }
  else {
    if (join != (connector *)0x0) {
      __assert_fail("cached_join == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0xdee,"struct chunk *lair_gen(struct player *, int, int, const char **)");
    }
    wVar17 = wVar9 / 2;
  }
  uVar5 = Rand_div(2);
  wVar18 = wVar17;
  ncol = wVar9 - wVar17;
  if (uVar5 == 0) {
    wVar18 = L'\0';
    ncol = wVar17;
  }
  y0 = L'\0';
  if (uVar5 == 0) {
    y0 = wVar17;
  }
  pcVar10 = transform_join_list(join,wVar8,ncol,wVar18,in_R8D,wVar16,SUB41(uVar5,0));
  pdVar2 = dun;
  dun->join = pcVar10;
  x0 = (wchar_t)pdVar2->persist;
  c = (chunk *)modified_chunk(p,(int)p->depth,wVar8,ncol,pdVar2->persist);
  cave_connectors_free(dun->join);
  dun->join = join;
  if (c == (chunk *)0x0) {
    pcVar12 = "modified chunk could not be created";
  }
  else {
    if (uVar5 == 0) {
      wVar17 = wVar9 - wVar17;
    }
    pcVar10 = transform_join_list(join,wVar8,wVar17,y0,x0,wVar16,SUB41(uVar5,0));
    dun->join = pcVar10;
    c_00 = (chunk *)cavern_chunk((int)p->depth,wVar8,wVar17,pcVar10);
    cave_connectors_free(dun->join);
    dun->join = join;
    if (c_00 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar12 = "cavern chunk could not be created";
    }
    else {
      uVar6._0_2_ = p->depth;
      uVar6._2_2_ = p->max_lev;
      if ((ushort)((undefined2)uVar6 - 0x21) < 0xffe5) {
        uVar5 = (uint)(5 < (short)(undefined2)uVar6) * 4 + 1;
      }
      else {
        uVar5 = (uVar6 & 0xff) / 6;
      }
      _Var3 = new_player_spot((chunk_conflict *)c,p);
      if (_Var3) {
        uVar7 = Rand_div(4);
        if (0 < (int)(uVar5 + uVar7 + 1)) {
          uVar6 = uVar7 + uVar5 + 2;
          do {
            pick_and_place_distant_monster(c,p->grid,L'\0',true,c->depth);
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
        pcVar11 = dun->profile;
        if (L'\0' < (pcVar11->str).mag) {
          wVar16 = L'\0';
          do {
            build_streamer((chunk_conflict *)c,L'\x11',(pcVar11->str).mc);
            wVar16 = wVar16 + L'\x01';
            pcVar11 = dun->profile;
          } while (wVar16 < (pcVar11->str).mag);
        }
        if (L'\0' < (pcVar11->str).qua) {
          wVar16 = L'\0';
          do {
            build_streamer((chunk_conflict *)c,L'\x12',(pcVar11->str).qc);
            wVar16 = wVar16 + L'\x01';
            pcVar11 = dun->profile;
          } while (wVar16 < (pcVar11->str).qua);
        }
        uVar1 = z_info->level_monster_min;
        uVar7 = Rand_div(0x14);
        do {
          set_pit_type(c_00->depth,L'\0');
          _Var3 = mon_restrict(dun->pit_type->name,c_00->depth,c_00->depth,true);
        } while (!_Var3);
        if ((player->opts).opt[0x18] == true) {
          msg("Monster lair - %s",dun->pit_type->name);
        }
        wVar16 = c_00->height / 2;
        wVar17 = c_00->width / 2;
        spread_monsters(c_00,dun->pit_type->name,c_00->depth,uVar5 + 1 + uVar7 + (uint)uVar1,wVar16,
                        wVar17,wVar16,wVar17,'\a');
        mon_restrict((char *)0x0,c_00->depth,c_00->depth,false);
        c_01 = (chunk *)cave_new(wVar8,wVar9);
        c_01->depth = (int)p->depth;
        chunk_copy((chunk_conflict *)c_01,p,(chunk_conflict *)c,L'\0',wVar18,L'\0',false);
        chunk_copy((chunk_conflict *)c_01,p,(chunk_conflict *)c_00,L'\0',y0,L'\0',false);
        cave_free((chunk_conflict *)c);
        cave_free((chunk_conflict *)c_00);
        draw_rectangle(c_01,L'\0',L'\0',c_01->height + L'\xffffffff',c_01->width + L'\xffffffff',
                       L'\x16',L'\0',true);
        ensure_connectedness((chunk_conflict *)c_01,true);
        _Var3 = dun->persist;
        quest = dun->quest;
        wVar8 = rand_range(3,4);
        wVar9 = rand_range(1,2);
        handle_level_stairs((chunk_conflict *)c_01,_Var3,quest,wVar8,wVar9);
        uVar7 = Rand_div(uVar5);
        alloc_objects((chunk_conflict *)c_01,L'\x01',L'\0',uVar7 + L'\x01',c_01->depth,'\0');
        uVar5 = Rand_div(uVar5);
        alloc_objects((chunk_conflict *)c_01,L'\x01',L'\x01',(int)(uVar5 + 1) / 5,c_01->depth,'\0');
        iVar4 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x02',L'\x03',(int)iVar4,c_01->depth,'\x01');
        iVar4 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x03',L'\x03',(int)iVar4,c_01->depth,'\x01');
        iVar4 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)c_01,L'\x03',L'\x02',(int)iVar4,c_01->depth,'\x01');
        return (chunk_conflict *)c_01;
      }
      uncreate_artifacts((chunk_conflict *)c_00);
      cave_free((chunk_conflict *)c_00);
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar12 = "could not place player";
    }
  }
  *p_error = pcVar12;
  return (chunk_conflict *)0x0;
}

Assistant:

struct chunk *lair_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	int left_width, normal_width, lair_width;
	int normal_offset, lair_offset;
	struct chunk *c;
	struct chunk *normal;
	struct chunk *lair;
	struct connector *cached_join;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	cached_join = dun->join;
	dun->join = NULL;
	if (dun->persist) {
		left_width = 1 + find_joinfree_vertical_seam(cached_join,
			x_size / 2, MIN(5, x_size / 20), 0, y_size - 1);
		if (left_width < 4 || x_size - left_width < 4) return NULL;
	} else {
		assert(cached_join == NULL);
		left_width = x_size / 2;
	}
	if (one_in_(2)) {
		/* Place the normal part on the left. */
		normal_width = left_width;
		normal_offset = 0;
		lair_width = x_size - left_width;
		lair_offset = left_width;
	} else {
		/* Place the lair part on the left. */
		normal_width = x_size - left_width;
		normal_offset = left_width;
		lair_width = left_width;
		lair_offset = 0;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, normal_width,
		0, normal_offset, 0, false);
	normal = modified_chunk(p, p->depth, y_size, normal_width,
		dun->persist);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!normal) {
		*p_error = "modified chunk could not be created";
		return NULL;
	}

	/*
	 * The transformation applied here should match that for chunk_copy()
	 * below.
	 */
	dun->join = transform_join_list(cached_join, y_size, lair_width,
		0, lair_offset, 0, false);
	lair = cavern_chunk(p->depth, y_size, lair_width, dun->join);
	/* Done with the transformed connector information. */
	cave_connectors_free(dun->join);
	dun->join = cached_join;
	if (!lair) {
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "cavern chunk could not be created";
		return NULL;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the normal half */
	if (!new_player_spot(normal, p)) {
		uncreate_artifacts(lair);
		cave_free(lair);
		uncreate_artifacts(normal);
		wipe_mon_list(normal, p);
		cave_free(normal);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a smallish number of monsters for the normal half */
	i = randint1(4) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(normal, p->grid, 0, true,
			normal->depth);
	}

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(normal, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(normal, FEAT_QUARTZ, dun->profile->str.qc);

	/* Pick a larger number of monsters for the lair */
	i = (z_info->level_monster_min + randint1(20) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(lair->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, lair->depth, lair->depth, true))
			break;
	}

	ROOM_LOG("Monster lair - %s", dun->pit_type->name);

	/* Place lair monsters */
	spread_monsters(lair, dun->pit_type->name, lair->depth, i, lair->height / 2,
					lair->width / 2, lair->height / 2, lair->width / 2, 
					ORIGIN_CAVERN);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, lair->depth, lair->depth, false);

	/* Make the level */
	c = cave_new(y_size, x_size);
	c->depth = p->depth;
	chunk_copy(c, p, normal, 0, normal_offset, 0, false);
	chunk_copy(c, p, lair, 0, lair_offset, 0, false);

	/* Free the chunks */
	cave_free(normal);
	cave_free(lair);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}